

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeeze.cpp
# Opt level: O0

int __thiscall ncnn::Squeeze::forward(Squeeze *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  long in_RSI;
  long in_RDI;
  int dims;
  int channels;
  int h;
  int w;
  Mat *in_stack_fffffffffffffe30;
  Mat *in_stack_fffffffffffffe38;
  Mat *this_00;
  Allocator *in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe74;
  Mat *in_stack_fffffffffffffe78;
  Mat local_160 [5];
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_4;
  
  local_2c = *(int *)(in_RSI + 0x24);
  local_30 = *(int *)(in_RSI + 0x28);
  local_34 = *(int *)(in_RSI + 0x2c);
  local_38 = *(int *)(in_RSI + 0x20);
  Mat::operator=(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  if (((*(int *)(in_RDI + 0x88) == 0) || (local_38 != 3)) || (local_34 != 1)) {
    if (((*(int *)(in_RDI + 0x84) == 0) || (local_38 < 2)) || (local_30 != 1)) {
      if (((*(int *)(in_RDI + 0x80) != 0) && (0 < local_38)) && (local_2c == 1)) {
        if ((*(int *)(in_RDI + 0x84) == 0) || (local_30 != 1)) {
          in_stack_fffffffffffffe30 = (Mat *)&stack0xfffffffffffffe68;
          Mat::reshape(in_stack_fffffffffffffe78,in_stack_fffffffffffffe74,in_stack_fffffffffffffe70
                       ,in_stack_fffffffffffffe68);
          Mat::operator=(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
          Mat::~Mat((Mat *)0x149110);
        }
        else {
          this_00 = local_160;
          Mat::reshape(in_stack_fffffffffffffe78,in_stack_fffffffffffffe74,in_stack_fffffffffffffe68
                      );
          Mat::operator=(this_00,in_stack_fffffffffffffe30);
          Mat::~Mat((Mat *)0x149099);
        }
      }
    }
    else if ((*(int *)(in_RDI + 0x80) == 0) || (local_2c != 1)) {
      Mat::reshape(in_stack_fffffffffffffe78,in_stack_fffffffffffffe74,in_stack_fffffffffffffe70,
                   in_stack_fffffffffffffe68);
      Mat::operator=(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
      Mat::~Mat((Mat *)0x148fde);
    }
    else {
      Mat::reshape(in_stack_fffffffffffffe78,in_stack_fffffffffffffe74,in_stack_fffffffffffffe68);
      Mat::operator=(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
      Mat::~Mat((Mat *)0x148f5e);
    }
  }
  else if ((*(int *)(in_RDI + 0x84) == 0) || (local_30 != 1)) {
    Mat::reshape(in_stack_fffffffffffffe78,in_stack_fffffffffffffe74,in_stack_fffffffffffffe70,
                 in_stack_fffffffffffffe68);
    Mat::operator=(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    Mat::~Mat((Mat *)0x148e99);
  }
  else {
    Mat::reshape(in_stack_fffffffffffffe78,in_stack_fffffffffffffe74,in_stack_fffffffffffffe68);
    Mat::operator=(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    Mat::~Mat((Mat *)0x148e19);
  }
  bVar1 = Mat::empty(in_stack_fffffffffffffe30);
  if (bVar1) {
    local_4 = -100;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Squeeze::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;

    top_blob = bottom_blob;

    if (squeeze_c && dims == 3 && channels == 1)
    {
        if (squeeze_h && h == 1)
            top_blob = bottom_blob.reshape(w, opt.blob_allocator);
        else
            top_blob = bottom_blob.reshape(w, h, opt.blob_allocator);
    }
    else if (squeeze_h && dims >= 2 && h == 1)
    {
        if (squeeze_w && w == 1)
            top_blob = bottom_blob.reshape(channels, opt.blob_allocator);
        else
            top_blob = bottom_blob.reshape(w, channels, opt.blob_allocator);
    }
    else if (squeeze_w && dims >= 1 && w == 1)
    {
        if (squeeze_h && h == 1)
            top_blob = bottom_blob.reshape(channels, opt.blob_allocator);
        else
            top_blob = bottom_blob.reshape(h, channels, opt.blob_allocator);
    }

    if (top_blob.empty())
        return -100;

    return 0;
}